

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::Session::Session(Session *this)

{
  ConfigData *this_00;
  Config *pCVar1;
  int iVar2;
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar3;
  undefined4 extraout_var;
  IMutableContext *pIVar5;
  ostream *poVar6;
  undefined8 uVar7;
  exception_ptr local_d0 [2];
  Colour colourGuard;
  ReusableStringStream local_b0 [2];
  Parser local_90;
  long *plVar4;
  
  Clara::Parser::Parser(&this->m_cli);
  this_00 = &this->m_configData;
  ConfigData::ConfigData(this_00);
  (this->m_config).m_ptr = (Config *)0x0;
  this->m_startupExceptions = false;
  if (Session()::alreadyInstantiated == '\x01') {
    ReusableStringStream::ReusableStringStream(local_b0);
    _colourGuard = 
    "/workspace/llm4binary/github/license_c_cmakelists/H-EAL[P]oqpi/tests/catch_amalgamated.cpp";
    Catch::operator<<(local_b0[0].m_oss,(SourceLineInfo *)&colourGuard);
    std::operator<<(local_b0[0].m_oss,": Internal Catch2 error: ");
    std::operator<<(local_b0[0].m_oss,"Only one instance of Catch::Session can ever be used");
    std::__cxx11::stringbuf::str();
    throw_logic_error((string *)&local_90);
  }
  pSVar3 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
           ::getInternal();
  iVar2 = (*(pSVar3->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[6])(pSVar3);
  plVar4 = (long *)CONCAT44(extraout_var,iVar2);
  if (*plVar4 != plVar4[1]) {
    config(this);
    pIVar5 = getCurrentMutableContext();
    (*(pIVar5->super_IContext)._vptr_IContext[7])(pIVar5,(this->m_config).m_ptr);
    this->m_startupExceptions = true;
    _colourGuard = (char *)((ulong)_colourGuard & 0xffffffffffffff00);
    Colour::use(Red);
    poVar6 = std::operator<<((ostream *)&std::cerr,"Errors occurred during startup!");
    std::operator<<(poVar6,'\n');
    if ((exception_ptr *)*plVar4 != (exception_ptr *)plVar4[1]) {
      std::__exception_ptr::exception_ptr::exception_ptr(local_d0,(exception_ptr *)*plVar4);
      uVar7 = std::rethrow_exception((exception_ptr)local_d0);
      Colour::~Colour(&colourGuard);
      pCVar1 = (this->m_config).m_ptr;
      if (pCVar1 != (Config *)0x0) {
        (*(pCVar1->super_IConfig)._vptr_IConfig[1])();
      }
      ConfigData::~ConfigData(this_00);
      Clara::Parser::~Parser(&this->m_cli);
      _Unwind_Resume(uVar7);
    }
    Colour::~Colour(&colourGuard);
  }
  Session()::alreadyInstantiated = '\x01';
  makeCommandLineParser(&local_90,this_00);
  Clara::Parser::operator=(&this->m_cli,&local_90);
  Clara::Parser::~Parser(&local_90);
  return;
}

Assistant:

Session::Session() {
        static bool alreadyInstantiated = false;
        if (alreadyInstantiated) {
            CATCH_TRY{ CATCH_INTERNAL_ERROR("Only one instance of Catch::Session can ever be used"); }
            CATCH_CATCH_ALL{ getMutableRegistryHub().registerStartupException(); }